

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O3

void __thiscall
checker_texture::checker_texture(checker_texture *this,double scale,color *c1,color *c2)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<texture> local_50;
  shared_ptr<texture> local_40;
  
  local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001285b0;
  local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__texture_00128600;
  pp_Var1 = (_func_int **)c1->e[1];
  *(double *)
   &local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = c1->e[0];
  local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = pp_Var1;
  *(double *)
   &local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = c1->e[2];
  local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001285b0;
  local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__texture_00128600;
  pp_Var1 = (_func_int **)c2->e[1];
  *(double *)
   &local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = c2->e[0];
  local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = pp_Var1;
  *(double *)
   &local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = c2->e[2];
  checker_texture(this,scale,&local_50,&local_40);
  if (local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

checker_texture(double scale, const color& c1, const color& c2)
      : checker_texture(scale, make_shared<solid_color>(c1), make_shared<solid_color>(c2)) {}